

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d.cpp
# Opt level: O0

void __thiscall
ncnn::Convolution1D::make_padding
          (Convolution1D *this,Mat *bottom_blob,Mat *bottom_blob_bordered,int _kernel_w,Option *opt)

{
  int in_ECX;
  long in_RSI;
  long in_RDI;
  void *in_R8;
  Option opt_b_2;
  int wpad_1;
  Option opt_b_1;
  int wpad;
  Option opt_b;
  int kernel_extent_w;
  int w;
  Mat *in_stack_fffffffffffffee0;
  Mat *in_stack_fffffffffffffee8;
  undefined1 local_100 [8];
  undefined8 local_f8;
  float in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  Mat *in_stack_ffffffffffffff28;
  Mat *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff40;
  Option *in_stack_ffffffffffffff48;
  undefined1 local_70 [8];
  undefined8 local_68;
  int local_30;
  int local_2c;
  void *local_28;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RDI + 0xd8) * (in_ECX + -1) + 1;
  local_28 = in_R8;
  ncnn::Mat::operator=(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  if ((*(int *)(in_RDI + 0xe0) < 1) && (*(int *)(in_RDI + 0xe4) < 1)) {
    if ((*(int *)(in_RDI + 0xe0) == -0xe9) && (*(int *)(in_RDI + 0xe4) == -0xe9)) {
      if (0 < (local_30 + ((local_2c + -1) / *(int *)(in_RDI + 0xdc)) * *(int *)(in_RDI + 0xdc)) -
              local_2c) {
        memcpy(&stack0xffffffffffffff48,local_28,0x40);
        copy_make_border(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                         in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,
                         in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
                         in_stack_ffffffffffffff40,in_stack_ffffffffffffff14,
                         in_stack_ffffffffffffff48);
      }
    }
    else if ((*(int *)(in_RDI + 0xe0) == -0xea) &&
            ((*(int *)(in_RDI + 0xe4) == -0xea &&
             (0 < (local_30 + ((local_2c + -1) / *(int *)(in_RDI + 0xdc)) * *(int *)(in_RDI + 0xdc))
                  - local_2c)))) {
      memcpy(local_100,local_28,0x40);
      local_f8 = *(undefined8 *)((long)local_28 + 0x10);
      copy_make_border(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24
                       ,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                       in_stack_ffffffffffffff18,in_stack_ffffffffffffff40,in_stack_ffffffffffffff14
                       ,in_stack_ffffffffffffff48);
    }
  }
  else {
    memcpy(local_70,local_28,0x40);
    local_68 = *(undefined8 *)((long)local_28 + 0x10);
    copy_make_border(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                     in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
                     in_stack_ffffffffffffff40,in_stack_ffffffffffffff14,in_stack_ffffffffffffff48);
  }
  return;
}

Assistant:

void Convolution1D::make_padding(const Mat& bottom_blob, Mat& bottom_blob_bordered, int _kernel_w, const Option& opt) const
{
    int w = bottom_blob.w;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;

    bottom_blob_bordered = bottom_blob;
    if (pad_left > 0 || pad_right > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_left == -233 && pad_right == -233)
    {
        // tensorflow padding=SAME or onnx padding=SAME_UPPER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        if (wpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    else if (pad_left == -234 && pad_right == -234)
    {
        // onnx padding=SAME_LOWER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        if (wpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
}